

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_trie.c
# Opt level: O0

void read_word_str(ngram_model_t *base,FILE *fp,int do_swap)

{
  void *__ptr;
  char *pcVar1;
  void *pvVar2;
  size_t sVar3;
  char *tmp_word_str;
  uint32 j;
  uint32 i;
  int32 k;
  int do_swap_local;
  FILE *fp_local;
  ngram_model_t *base_local;
  
  base->writable = '\x01';
  i = do_swap;
  _k = (FILE *)fp;
  fp_local = (FILE *)base;
  fread(&j,4,1,(FILE *)fp);
  if (i != 0) {
    j = (int)j >> 0x18 & 0xffU | (int)j >> 8 & 0xff00U | (j & 0xff00) << 8 | j << 0x18;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
          ,0x140,"#word_str: %d\n",(ulong)j);
  __ptr = __ckd_calloc__((long)(int)j,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                         ,0x141);
  fread(__ptr,1,(long)(int)j,_k);
  tmp_word_str._0_4_ = 0;
  for (tmp_word_str._4_4_ = 0; tmp_word_str._4_4_ < j; tmp_word_str._4_4_ = tmp_word_str._4_4_ + 1)
  {
    if (*(char *)((long)__ptr + (ulong)tmp_word_str._4_4_) == '\0') {
      tmp_word_str._0_4_ = (uint)tmp_word_str + 1;
    }
  }
  if ((uint)tmp_word_str != *(uint *)fp_local->_IO_read_ptr) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
            ,0x14b,"Error reading word strings (%d doesn\'t match n_unigrams %d)\n",
            (ulong)(uint)tmp_word_str,(ulong)*(uint *)fp_local->_IO_read_ptr);
  }
  tmp_word_str._0_4_ = 0;
  for (tmp_word_str._4_4_ = 0; tmp_word_str._4_4_ < *(uint *)fp_local->_IO_read_ptr;
      tmp_word_str._4_4_ = tmp_word_str._4_4_ + 1) {
    pcVar1 = __ckd_salloc__((char *)((long)__ptr + (ulong)(uint)tmp_word_str),
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                            ,0x151);
    *(char **)(fp_local->_IO_buf_base + (ulong)tmp_word_str._4_4_ * 8) = pcVar1;
    pvVar2 = hash_table_enter((hash_table_t *)fp_local->_IO_buf_end,
                              *(char **)(fp_local->_IO_buf_base + (ulong)tmp_word_str._4_4_ * 8),
                              (void *)(ulong)tmp_word_str._4_4_);
    if (pvVar2 != (void *)(ulong)tmp_word_str._4_4_) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
              ,0x155,"Duplicate word in dictionary: %s\n",
              *(undefined8 *)(fp_local->_IO_buf_base + (ulong)tmp_word_str._4_4_ * 8));
    }
    sVar3 = strlen(*(char **)(fp_local->_IO_buf_base + (ulong)tmp_word_str._4_4_ * 8));
    tmp_word_str._0_4_ = (uint)tmp_word_str + (int)sVar3 + 1;
  }
  free(__ptr);
  return;
}

Assistant:

static void
read_word_str(ngram_model_t * base, FILE * fp, int do_swap)
{
    int32 k;
    uint32 i, j;
    char *tmp_word_str;
    /* read ascii word strings */
    base->writable = TRUE;
    fread(&k, sizeof(k), 1, fp);
    if (do_swap)
        SWAP_INT32(&k);
    E_INFO("#word_str: %d\n", k);
    tmp_word_str = (char *) ckd_calloc((size_t) k, 1);
    fread(tmp_word_str, 1, (size_t) k, fp);

    /* First make sure string just read contains n_counts[0] words (PARANOIA!!) */
    for (i = 0, j = 0; i < (uint32) k; i++)
        if (tmp_word_str[i] == '\0')
            j++;
    if (j != base->n_counts[0]) {
        E_ERROR
            ("Error reading word strings (%d doesn't match n_unigrams %d)\n",
             j, base->n_counts[0]);
    }

    /* Break up string just read into words */
    j = 0;
    for (i = 0; i < base->n_counts[0]; i++) {
        base->word_str[i] = ckd_salloc(tmp_word_str + j);
        if (hash_table_enter(base->wid, base->word_str[i],
                             (void *) (size_t) i) != (void *) (size_t) i) {
            E_WARN("Duplicate word in dictionary: %s\n",
                   base->word_str[i]);
        }
        j += strlen(base->word_str[i]) + 1;
    }
    free(tmp_word_str);
}